

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O2

void __thiscall cmState::Snapshot::ComputeRelativePathTopSource(Snapshot *this)

{
  bool bVar1;
  char *pcVar2;
  PointerType pSVar3;
  PointerType pBVar4;
  Snapshot *this_00;
  vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_> snapshots;
  string result;
  Snapshot snapshot;
  string currentSource;
  allocator local_a9;
  _Vector_base<cmState::Snapshot,_std::allocator<cmState::Snapshot>_> local_a8;
  string local_88;
  value_type local_68;
  string local_48;
  
  local_68.Position.Position = (this->Position).Position;
  local_68.State = this->State;
  local_68.Position.Tree = (this->Position).Tree;
  local_a8._M_impl.super__Vector_impl_data._M_start = (Snapshot *)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_finish = (Snapshot *)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>::push_back
            ((vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_> *)&local_a8,&local_68);
  while( true ) {
    GetBuildsystemDirectoryParent((Snapshot *)&local_88,&local_68);
    local_68.Position.Position = local_88.field_2._M_allocated_capacity;
    local_68.State = (cmState *)local_88._M_dataplus._M_p;
    local_68.Position.Tree = (cmLinkedTree<cmState::SnapshotDataType> *)local_88._M_string_length;
    bVar1 = IsValid(&local_68);
    if (!bVar1) break;
    std::vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>::push_back
              ((vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_> *)&local_a8,&local_68)
    ;
  }
  pcVar2 = GetCurrentSourceDirectory(local_a8._M_impl.super__Vector_impl_data._M_start);
  std::__cxx11::string::string((string *)&local_88,pcVar2,(allocator *)&local_48);
  this_00 = local_a8._M_impl.super__Vector_impl_data._M_start;
  while (this_00 = this_00 + 1, this_00 != local_a8._M_impl.super__Vector_impl_data._M_finish) {
    pcVar2 = GetCurrentSourceDirectory(this_00);
    std::__cxx11::string::string((string *)&local_48,pcVar2,&local_a9);
    bVar1 = cmsys::SystemTools::IsSubDirectory(&local_88,&local_48);
    if (bVar1) {
      std::__cxx11::string::_M_assign((string *)&local_88);
    }
    std::__cxx11::string::~string((string *)&local_48);
  }
  pSVar3 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&this->Position);
  pBVar4 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar3->BuildSystemDirectory);
  std::__cxx11::string::_M_assign((string *)&pBVar4->RelativePathTopSource);
  std::__cxx11::string::~string((string *)&local_88);
  std::_Vector_base<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>::~_Vector_base(&local_a8)
  ;
  return;
}

Assistant:

void cmState::Snapshot::ComputeRelativePathTopSource()
{
  // Relative path conversion inside the source tree is not used to
  // construct relative paths passed to build tools so it is safe to use
  // even when the source is a network path.

  cmState::Snapshot snapshot = *this;
  std::vector<cmState::Snapshot> snapshots;
  snapshots.push_back(snapshot);
  while (true)
    {
    snapshot = snapshot.GetBuildsystemDirectoryParent();
    if (snapshot.IsValid())
      {
      snapshots.push_back(snapshot);
      }
    else
      {
      break;
      }
    }

  std::string result = snapshots.front().GetCurrentSourceDirectory();

  for (std::vector<cmState::Snapshot>::const_iterator it =
       snapshots.begin() + 1; it != snapshots.end(); ++it)
    {
    std::string currentSource = it->GetCurrentSourceDirectory();
    if(cmSystemTools::IsSubDirectory(result, currentSource))
      {
      result = currentSource;
      }
    }
  this->Position->BuildSystemDirectory->RelativePathTopSource = result;
}